

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Articulated_Parts_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Articulated_Parts_PDU::ClearVariableParameters(Articulated_Parts_PDU *this)

{
  pointer pKVar1;
  pointer pKVar2;
  pointer pKVar3;
  
  pKVar1 = (this->m_vVariableParameters).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pKVar2 = (this->m_vVariableParameters).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pKVar3 = pKVar1;
  if (pKVar2 != pKVar1) {
    do {
      (**pKVar3->_vptr_KRef_Ptr)(pKVar3);
      pKVar3 = pKVar3 + 1;
    } while (pKVar3 != pKVar2);
    (this->m_vVariableParameters).
    super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pKVar1;
  }
  this->m_ui8NumOfVariableParams = '\0';
  (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength = 0x11;
  return;
}

Assistant:

void Articulated_Parts_PDU::ClearVariableParameters()
{
    m_vVariableParameters.clear();
    m_ui8NumOfVariableParams = 0;
    m_ui16PDULength = ARTICULATED_PARTS_PDU_SIZE;
}